

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O3

int ddExtSymmCheck(DdManager *table,int x,int y)

{
  DdHalfWord y_00;
  DdSubtable *pDVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  anon_union_16_2_50f58667_for_type *paVar4;
  int iVar5;
  uint uVar6;
  DdNode *pDVar7;
  int iVar8;
  long lVar9;
  DdManager *pDVar10;
  DdNode *pDVar11;
  DdNode *pDVar12;
  DdNode *pDVar13;
  DdHalfWord DVar14;
  DdNode *pDVar15;
  bool bVar16;
  
  y_00 = table->invperm[y];
  iVar5 = cuddTestInteract(table,table->invperm[x],y_00);
  if (iVar5 == 0) {
LAB_007daa45:
    uVar6 = 0;
  }
  else {
    pDVar1 = table->subtables;
    if ((long)(int)pDVar1[x].slots < 1) {
      iVar5 = 0;
    }
    else {
      iVar8 = (int)(((double)table->symmviolation / 100.0) * (double)pDVar1[x].keys + 0.5);
      lVar9 = 0;
      iVar5 = 0;
      do {
        for (pDVar10 = (DdManager *)pDVar1[x].nodelist[lVar9]; pDVar10 != table;
            pDVar10 = (DdManager *)(pDVar10->sentinel).next) {
          pDVar7 = (pDVar10->sentinel).type.kids.T;
          pDVar2 = (pDVar10->sentinel).type.kids.E;
          pDVar12 = (DdNode *)((ulong)pDVar2 & 0xfffffffffffffffe);
          bVar16 = true;
          if ((pDVar7 == table->one) && (table->one == pDVar12)) {
            bVar16 = (pDVar10->sentinel).ref != 1;
          }
          if (pDVar7->index == y_00) {
            iVar5 = iVar5 + 1;
            paVar4 = &pDVar7->type;
            DVar14 = pDVar12->index;
            pDVar7 = (pDVar7->type).kids.T;
            pDVar11 = (paVar4->kids).E;
          }
          else {
            DVar14 = pDVar12->index;
            pDVar11 = pDVar7;
            if ((bool)(DVar14 != y_00 & bVar16)) {
              if (iVar8 == 0) goto LAB_007daa45;
              iVar8 = iVar8 + -1;
            }
          }
          pDVar13 = pDVar12;
          if (DVar14 == y_00) {
            iVar5 = iVar5 + 1;
            paVar4 = &pDVar12->type;
            pDVar12 = (pDVar12->type).kids.T;
            pDVar13 = (paVar4->kids).E;
          }
          pDVar15 = (DdNode *)((ulong)pDVar12 ^ 1);
          pDVar3 = (DdNode *)((ulong)pDVar13 ^ 1);
          if (((ulong)pDVar2 & 1) == 0) {
            pDVar15 = pDVar12;
            pDVar3 = pDVar13;
          }
          if (((bVar16) && (pDVar15 != pDVar11)) && (pDVar7 != pDVar3)) {
            if (iVar8 == 0) goto LAB_007daa45;
            iVar8 = iVar8 + -1;
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != (int)pDVar1[x].slots);
    }
    if ((long)(int)pDVar1[y].slots < 1) {
      iVar8 = -1;
    }
    else {
      iVar8 = -1;
      lVar9 = 0;
      do {
        for (pDVar10 = (DdManager *)pDVar1[y].nodelist[lVar9]; pDVar10 != table;
            pDVar10 = (DdManager *)(pDVar10->sentinel).next) {
          iVar8 = iVar8 + (pDVar10->sentinel).ref;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != (int)pDVar1[y].slots);
    }
    uVar6 = (uint)(iVar8 - (int)(((double)table->arcviolation / 100.0) * (double)pDVar1[y].keys +
                                0.5) <= iVar5);
  }
  return uVar6;
}

Assistant:

static int
ddExtSymmCheck(
  DdManager * table,
  int  x,
  int  y)
{
    DdNode *f,*f0,*f1,*f01,*f00,*f11,*f10;
    DdNode *one;
    unsigned comple;    /* f0 is complemented */
    int notproj;        /* f is not a projection function */
    int arccount;       /* number of arcs from layer x to layer y */
    int TotalRefCount;  /* total reference count of layer y minus 1 */
    int counter;        /* number of nodes of layer x that are allowed */
                        /* to violate extended symmetry conditions */
    int arccounter;     /* number of arcs into layer y that are allowed */
                        /* to come from layers other than x */
    int i;
    int xindex;
    int yindex;
    int res;
    int slots;
    DdNodePtr *list;
    DdNode *sentinel = &(table->sentinel);

    xindex = table->invperm[x];
    yindex = table->invperm[y];

    /* If the two variables do not interact, we do not want to merge them. */
    if (!cuddTestInteract(table,xindex,yindex))
        return(0);

#ifdef DD_DEBUG
    /* Checks that x and y do not contain just the projection functions.
    ** With the test on interaction, these test become redundant,
    ** because an isolated projection function does not interact with
    ** any other variable.
    */
    if (table->subtables[x].keys == 1) {
        assert(table->vars[xindex]->ref != 1);
    }
    if (table->subtables[y].keys == 1) {
        assert(table->vars[yindex]->ref != 1);
    }
#endif

#ifdef DD_STATS
    extsymmcalls++;
#endif

    arccount = 0;
    counter = (int) (table->subtables[x].keys *
              (table->symmviolation/100.0) + 0.5);
    one = DD_ONE(table);

    slots = table->subtables[x].slots;
    list = table->subtables[x].nodelist;
    for (i = 0; i < slots; i++) {
        f = list[i];
        while (f != sentinel) {
            /* Find f1, f0, f11, f10, f01, f00. */
            f1 = cuddT(f);
            f0 = Cudd_Regular(cuddE(f));
            comple = Cudd_IsComplement(cuddE(f));
            notproj = f1 != one || f0 != one || f->ref != (DdHalfWord) 1;
            if (f1->index == (unsigned) yindex) {
                arccount++;
                f11 = cuddT(f1); f10 = cuddE(f1);
            } else {
                if ((int) f0->index != yindex) {
                    /* If f is an isolated projection function it is
                    ** allowed to bypass layer y.
                    */
                    if (notproj) {
                        if (counter == 0)
                            return(0);
                        counter--; /* f bypasses layer y */
                    }
                }
                f11 = f10 = f1;
            }
            if ((int) f0->index == yindex) {
                arccount++;
                f01 = cuddT(f0); f00 = cuddE(f0);
            } else {
                f01 = f00 = f0;
            }
            if (comple) {
                f01 = Cudd_Not(f01);
                f00 = Cudd_Not(f00);
            }

            /* Unless we are looking at a projection function
            ** without external references except the one from the
            ** table, we insist that f01 == f10 or f11 == f00
            */
            if (notproj) {
                if (f01 != f10 && f11 != f00) {
                    if (counter == 0)
                        return(0);
                    counter--;
                }
            }

            f = f->next;
        } /* while */
    } /* for */

    /* Calculate the total reference counts of y */
    TotalRefCount = -1; /* -1 for projection function */
    slots = table->subtables[y].slots;
    list = table->subtables[y].nodelist;
    for (i = 0; i < slots; i++) {
        f = list[i];
        while (f != sentinel) {
            TotalRefCount += f->ref;
            f = f->next;
        }
    }

    arccounter = (int) (table->subtables[y].keys *
                 (table->arcviolation/100.0) + 0.5);
    res = arccount >= TotalRefCount - arccounter;

#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    if (res) {
        (void) fprintf(table->out,
                       "Found extended symmetry! x = %d\ty = %d\tPos(%d,%d)\n",
                       xindex,yindex,x,y);
    }
#endif

#ifdef DD_STATS
    if (res)
        extsymm++;
#endif
    return(res);

}